

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

uint32 rw::wdgl::skinInstanceCB(Geometry *g,int32 i,uint32 offset)

{
  InstanceDataHeader *pIVar1;
  uint uVar2;
  undefined4 *puVar3;
  void *pvVar4;
  Skin *pSVar5;
  AttribDesc *a_00;
  uint8 *puVar6;
  int local_5c;
  float *pfStack_58;
  int32 i_1;
  float32 *weights;
  uint8 *indices;
  uint8 *idx;
  uint8 *wgt;
  Skin *skin;
  AttribDesc *a;
  InstanceDataHeader *header;
  uint32 offset_local;
  int32 i_local;
  Geometry *g_local;
  
  pIVar1 = g->instData;
  puVar3 = (undefined4 *)(*(long *)(pIVar1 + 2) + (long)i * 0x18);
  *puVar3 = 4;
  puVar3[1] = 2;
  puVar3[2] = 1;
  puVar3[3] = 4;
  puVar3[5] = offset;
  puVar3[6] = 5;
  puVar3[7] = 2;
  puVar3[8] = 0;
  puVar3[9] = 4;
  puVar3[0xb] = offset + 4;
  uVar2 = offset + 8;
  pIVar1[4].platform = uVar2 * g->numVertices;
  pvVar4 = mustmalloc_LOC((ulong)pIVar1[4].platform,0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 617"
                         );
  *(void **)(pIVar1 + 6) = pvVar4;
  pSVar5 = Skin::get(g);
  if (pSVar5 != (Skin *)0x0) {
    a_00 = (AttribDesc *)(*(long *)(pIVar1 + 2) + (long)i * 0x18);
    idx = (uint8 *)(*(long *)(pIVar1 + 6) + (ulong)a_00->offset);
    indices = (uint8 *)(*(long *)(pIVar1 + 6) + (ulong)a_00[1].offset);
    weights = (float32 *)pSVar5->indices;
    pfStack_58 = pSVar5->weights;
    for (local_5c = 0; local_5c < g->numVertices; local_5c = local_5c + 1) {
      packattrib(idx,(float32 *)pfStack_58,a_00,1.0);
      pfStack_58 = (float *)((float32 *)pfStack_58 + 4);
      idx = idx + uVar2;
      *indices = *(uint8 *)weights;
      indices[1] = *(uint8 *)((long)weights + 1);
      puVar6 = (uint8 *)((long)weights + 3);
      indices[2] = *(uint8 *)((long)weights + 2);
      weights = weights + 1;
      indices[3] = *puVar6;
      indices = indices + uVar2;
    }
  }
  return 8;
}

Assistant:

uint32
skinInstanceCB(Geometry *g, int32 i, uint32 offset)
{
	InstanceDataHeader *header = (InstanceDataHeader*)g->instData;
	AttribDesc *a = &header->attribs[i];
	// weights
	a->index = 4;
	a->type = 2;	/* but also short o_O */
	a->normalized = 1;
	a->size = 4;
	a->offset = offset;
	offset += 4;
	a++;

	// indices
	a->index = 5;
	a->type = 2;
	a->normalized = 0;
	a->size = 4;
	a->offset = offset;
	offset += 4;

	header->dataSize = offset*g->numVertices;
	header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);

	Skin *skin = Skin::get(g);
	if(skin == nil)
		return 8;

	a = &header->attribs[i];
	uint8 *wgt = header->data + a[0].offset;
	uint8 *idx = header->data + a[1].offset;
	uint8 *indices = skin->indices;
	float32 *weights = skin->weights;
	for(int32 i = 0; i < g->numVertices; i++){
		packattrib(wgt, weights, a);
		weights += 4;
		wgt += offset;
		idx[0] = *indices++;
		idx[1] = *indices++;
		idx[2] = *indices++;
		idx[3] = *indices++;
		idx += offset;
	}

	return 8;
}